

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O1

void __thiscall mognetwork::TcpASIOListener::run(TcpASIOListener *this)

{
  list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
  *plVar1;
  int iVar2;
  SocketFD SVar3;
  Status SVar4;
  TcpSocket *this_00;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  list<int,_std::allocator<int>_> triggeredList;
  undefined4 local_64;
  list<int,_std::allocator<int>_> *local_60;
  Selector *local_58;
  list<int,_std::allocator<int>_> *local_50;
  list<int,_std::allocator<int>_> local_48;
  
  if (this->m_running == true) {
    local_58 = &this->m_selector;
    local_60 = &(this->m_selector).m_readUpdated;
    plVar1 = &this->m_listeners;
    local_50 = &(this->m_selector).m_readSockets;
    do {
      Selector::waitForTrigger(local_58);
      if ((this->m_selector).m_state == Error) {
        poVar6 = (ostream *)&std::cerr;
        pcVar7 = "Select error on listening thread.";
        lVar5 = 0x21;
        goto LAB_0010c966;
      }
      std::__cxx11::list<int,_std::allocator<int>_>::list(&local_48,local_60);
      for (p_Var9 = local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next;
          p_Var8 = local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                   super__List_node_base._M_next, p_Var9 != (_List_node_base *)&local_48;
          p_Var9 = (((_List_base<int,_std::allocator<int>_> *)&p_Var9->_M_next)->_M_impl)._M_node.
                   super__List_node_base._M_next) {
        iVar2 = *(int *)&p_Var9[1]._M_next;
        SVar3 = Socket::getSocketFD((Socket *)this->m_serverSocket);
        if (iVar2 == SVar3) {
          Mutex::lock(this->m_mutex);
          acceptClient(this);
          Mutex::unlock(this->m_mutex);
        }
        else if (*(int *)&p_Var9[1]._M_next != this->m_pipefd[0]) {
          Mutex::lock(this->m_mutex);
          this_00 = TcpASIOServer::getSocketByFd(this->m_server,*(SocketFD *)&p_Var9[1]._M_next);
          TcpSocket::setServer(this_00,this->m_server);
          SVar4 = TcpSocket::readPendingDatas(this_00);
          if (SVar4 != Waiting) {
            p_Var8 = (_List_node_base *)plVar1;
            if (SVar4 == Ok) {
              while (p_Var8 = (((_List_base<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                                 *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next
                    , p_Var8 != (_List_node_base *)plVar1) {
                (**(code **)(*(long *)p_Var8[1]._M_next + 0x18))(p_Var8[1]._M_next,this_00);
              }
            }
            else {
              while (p_Var8 = (((_List_base<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
                                 *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next
                    , p_Var8 != (_List_node_base *)plVar1) {
                (**(code **)(*(long *)p_Var8[1]._M_next + 0x20))(p_Var8[1]._M_next,this_00);
              }
              local_64 = *(undefined4 *)&p_Var9[1]._M_next;
              std::__cxx11::list<int,_std::allocator<int>_>::remove(local_50,(char *)&local_64);
              TcpASIOServer::remSocket(this->m_server,*(SocketFD *)&p_Var9[1]._M_next);
            }
          }
          Mutex::unlock(this->m_mutex);
        }
      }
      while (p_Var8 != (_List_node_base *)&local_48) {
        p_Var9 = p_Var8->_M_next;
        operator_delete(p_Var8);
        p_Var8 = p_Var9;
      }
    } while (this->m_running != false);
  }
  poVar6 = (ostream *)&std::cout;
  pcVar7 = "Listener Thread stopped.";
  lVar5 = 0x18;
LAB_0010c966:
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,lVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void TcpASIOListener::run()
  {
    while (m_running)
      {
	m_selector.waitForTrigger();
	if (m_selector.getState() == Selector::Error)
	  {
	    std::cerr << "Select error on listening thread." << std::endl;
	    return ;
	}
	std::list<SocketFD> triggeredList = m_selector.getReadingTriggeredSockets();
	for (std::list<SocketFD>::iterator it = triggeredList.begin(); it != triggeredList.end(); ++it)
	  {
	    if (*it == m_serverSocket.getSocketFD())
	      {
		m_mutex->lock();
		// NEW CLIENT TO ACCEPT
		acceptClient();
		m_mutex->unlock();
	      }
	    else if (*it != m_pipefd[0])
	      {
		m_mutex->lock();
		TcpSocket* socket = m_server->getSocketByFd(*it);
		socket->setServer(m_server);
		Socket::Status status = socket->readPendingDatas();
		if (status == Socket::Ok)
		  {
		    // DATAS FULLY RECEIVED.
		    for (std::list<ITcpASIOListenerHandler*>::iterator it2 = m_listeners.begin();
			 it2 != m_listeners.end(); ++it2)
		      (*it2)->onReceivedData(*socket);
		  }
		else if (status != Socket::Waiting)
		  {
		    // DISCONNECTED
		    for (std::list<ITcpASIOListenerHandler*>::iterator it2 = m_listeners.begin();
			 it2 != m_listeners.end(); ++it2)
		      (*it2)->onDisconnect(*socket);
		    m_selector.remFdToRead(*it);
		    m_server->remSocket(*it);
		  }
		m_mutex->unlock();
	      }
	  }
      }
    std::cout << "Listener Thread stopped." << std::endl;
  }